

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

void __thiscall
CProficiencies::GetProfsTaughtByTrainer(CProficiencies *this,char_data *ch,char_data *trainer)

{
  long lVar1;
  ulong uVar2;
  basic_string_view<char> format;
  string_view fmt;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  long *local_2b0 [2];
  long local_2a0 [2];
  ulong local_290;
  char *local_288 [2];
  ulong local_278;
  buffer<char> local_268;
  char local_248 [536];
  
  if (ch == (char_data *)0x0) {
    fmt._M_str = "CProficiencies::GetProfsTaughtByTrainer: Charater is null.";
    fmt._M_len = 0x3a;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  if (trainer != (char_data *)0x0) {
    act("You may learn the following proficiencies from $N:",ch,(void *)0x0,trainer,3);
    if ((long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar1 = ((long)prof_table.
                     super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)prof_table.
                     super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      local_290 = lVar1 + (ulong)(lVar1 == 0);
      uVar2 = 0;
      do {
        lVar1 = 0;
        do {
          if (uVar2 == (uint)(int)trainer->pIndexData->profs_taught[lVar1]) {
            local_288[0] = prof_table.
                           super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar2].name;
            local_278 = (ulong)(uint)prof_table.
                                     super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar2].cost;
            local_268.size_ = 0;
            local_268._vptr_buffer = (_func_int **)&PTR_grow_00457340;
            local_268.ptr_ = local_248;
            local_268.capacity_ = 500;
            format.size_ = 0x13;
            format.data_ = "%-16s | %d points\n\r";
            args.field_1.values_ =
                 (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)local_288;
            args.desc_ = 0x1c;
            ::fmt::v9::detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
                      (&local_268,format,args);
            local_2b0[0] = local_2a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b0,local_268.ptr_,local_268.ptr_ + local_268.size_);
            if (local_268.ptr_ != local_248) {
              operator_delete(local_268.ptr_,local_268.capacity_);
            }
            send_to_char((char *)local_2b0[0],ch);
            if (local_2b0[0] != local_2a0) {
              operator_delete(local_2b0[0],local_2a0[0] + 1);
            }
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 != 4);
        uVar2 = uVar2 + 1;
      } while (uVar2 != local_290);
    }
    return;
  }
  send_to_char("Invalid trainer",ch);
  return;
}

Assistant:

void CProficiencies::GetProfsTaughtByTrainer(char_data* ch, char_data* trainer)
{
	if (ch == nullptr)
	{
		RS.Logger.Debug("CProficiencies::GetProfsTaughtByTrainer: Charater is null.");
		return;
	}
	
	if (trainer == nullptr)
	{
		send_to_char("Invalid trainer", ch);
		return;
	}

	act("You may learn the following proficiencies from $N:", ch, 0, trainer, TO_CHAR);

	auto prof_table_size = std::size(prof_table);
	auto profs_taught_size = std::size(trainer->pIndexData->profs_taught);
	for (auto i = 0; i < prof_table_size; i++)
	{
		for (auto j = 0; j < profs_taught_size; j++)
		{
			if (trainer->pIndexData->profs_taught[j] == i)
			{
				auto buffer = fmt::sprintf("%-16s | %d points\n\r", prof_table[i].name, prof_table[i].cost);
				send_to_char(buffer.c_str(), ch);
			}
		}
	}
}